

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O0

void __thiscall
acto::actor::consume_package
          (actor *this,unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *p)

{
  bool bVar1;
  pointer pmVar2;
  pointer ppVar3;
  pointer phVar4;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> local_30;
  _Node_iterator_base<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_false>
  local_20;
  iterator hi;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *p_local;
  actor *this_local;
  
  hi.
  super__Node_iterator_base<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_false>
               )p;
  pmVar2 = std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::operator->
                     (p);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>_>_>
       ::find(&this->handlers_,&pmVar2->type);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>_>_>
       ::end(&this->handlers_);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_false,_false>
                           *)&local_20);
    phVar4 = std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>::
             operator->(&ppVar3->second);
    std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::unique_ptr
              (&local_30,p);
    (*phVar4->_vptr_handler_t[2])(phVar4,&local_30);
    std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
              (&local_30);
  }
  return;
}

Assistant:

void actor::consume_package(std::unique_ptr<core::msg_t> p) {
  const auto hi = handlers_.find(p->type);
  if (hi != handlers_.end()) {
    hi->second->invoke(std::move(p));
  }
}